

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_randomizer_adaptations.hpp
# Opt level: O0

void PatchRandomizerAdaptations::prevent_hint_item_save_scumming(ROM *rom)

{
  size_t sVar1;
  uint32_t uVar2;
  Code *pCVar3;
  Code local_158;
  allocator<char> local_d1;
  string local_d0;
  uint32_t local_ac;
  uint32_t func_save_on_buy_addr;
  undefined1 local_88 [8];
  Code func_save_on_buy;
  ROM *rom_local;
  
  func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  md::Code::jsr((Code *)local_88,0x1592);
  addr_<void>((uint32_t)&stack0xffffffffffffff58,0xff1903);
  md::Code::moveb((Code *)local_88,0xff,(Param *)&stack0xffffffffffffff58);
  md::Code::rts((Code *)local_88);
  sVar1 = func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_88,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  sVar1 = func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_158._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_158._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_158._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_158._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._labels._M_t._M_impl._0_8_ = 0;
  local_158._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_158._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_158._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_158._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_158._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._pending_branches._M_t._M_impl._0_8_ = 0;
  local_158._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_ac = uVar2;
  md::Code::Code(&local_158);
  pCVar3 = md::Code::jsr(&local_158,local_ac);
  pCVar3 = md::Code::nop(pCVar3,1);
  md::ROM::set_code((ROM *)sVar1,0x24f48,pCVar3);
  md::Code::~Code(&local_158);
  md::Code::~Code((Code *)local_88);
  return;
}

Assistant:

static void prevent_hint_item_save_scumming(md::ROM& rom)
    {
        md::Code func_save_on_buy;
        {
            func_save_on_buy.jsr(0x1592);                   // Save game
            func_save_on_buy.moveb(0xFF, addr_(0xFF1903));  // Redo instruction that was removed by injection
        }
        func_save_on_buy.rts();
        uint32_t func_save_on_buy_addr = rom.inject_code(func_save_on_buy);

        rom.set_code(0x24F48, md::Code().jsr(func_save_on_buy_addr).nop());
    }